

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App_inl.hpp
# Opt level: O0

App * __thiscall CLI::App::get_subcommand(App *this,int index)

{
  size_type sVar1;
  __shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar2;
  OptionNotFound *this_01;
  string local_38;
  uint local_18;
  int local_14;
  uint uindex;
  int index_local;
  App *this_local;
  
  local_14 = index;
  _uindex = this;
  if ((-1 < index) &&
     (local_18 = index,
     sVar1 = std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>::
             size(&this->subcommands_), (uint)index < sVar1)) {
    this_00 = &std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>::
               operator[](&this->subcommands_,(ulong)local_18)->
               super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>;
    peVar2 = std::__shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>::get(this_00);
    return peVar2;
  }
  this_01 = (OptionNotFound *)__cxa_allocate_exception(0x38);
  std::__cxx11::to_string(&local_38,local_14);
  OptionNotFound::OptionNotFound(this_01,&local_38);
  __cxa_throw(this_01,&OptionNotFound::typeinfo,OptionNotFound::~OptionNotFound);
}

Assistant:

CLI11_NODISCARD CLI11_INLINE App *App::get_subcommand(int index) const {
    if(index >= 0) {
        auto uindex = static_cast<unsigned>(index);
        if(uindex < subcommands_.size())
            return subcommands_[uindex].get();
    }
    throw OptionNotFound(std::to_string(index));
}